

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

GetShapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_getshape(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x429) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x429;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.getshape_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::GetShapeLayerParams>
                   (arena);
    (this->layer_).getshape_ = (GetShapeLayerParams *)LVar2;
  }
  return (GetShapeLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::GetShapeLayerParams* NeuralNetworkLayer::_internal_mutable_getshape() {
  if (!_internal_has_getshape()) {
    clear_layer();
    set_has_getshape();
    layer_.getshape_ = CreateMaybeMessage< ::CoreML::Specification::GetShapeLayerParams >(GetArenaForAllocation());
  }
  return layer_.getshape_;
}